

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  pointer pbVar1;
  initializer_list<long> __l;
  bool bVar2;
  __type _Var3;
  int iVar4;
  size_type sVar5;
  ModelDescription *pMVar6;
  FeatureType *pFVar7;
  RepeatedField<long> *this;
  bool *pbVar8;
  Arena *pAVar9;
  FeatureDescription *pFVar10;
  DictionaryFeatureType *this_00;
  ArenaStringPtr *pAVar11;
  NeuralNetworkClassifier *this_01;
  reference pbVar12;
  StringVector *this_02;
  reference plVar13;
  Int64Vector *this_03;
  WeightParams *pWVar14;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar15;
  reference pFVar16;
  string *__lhs;
  string *__rhs;
  FeatureDescription *trainingInput_1;
  FeatureDescription feature_1;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_3;
  FeatureDescription *trainingInput;
  FeatureDescription feature;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *__range2_2;
  _Rb_tree_node_base _Stack_2a0;
  size_t sStack_280;
  set<long,_std::less<long>,_std::allocator<long>_> local_278;
  allocator<long> local_23a;
  less<long> local_239;
  long local_238 [4];
  iterator local_218;
  size_type local_210;
  set<long,_std::less<long>,_std::allocator<long>_> local_208;
  NeuralNetworkLayer *local_1d8;
  NeuralNetworkLayer *softmaxLayer;
  InnerProductLayerParams *pIStack_1c8;
  float random_1;
  uint64_t j_1;
  uint64_t i_1;
  float *destination_bias;
  RepeatedField<float> *local_1a8;
  RepeatedField<float> *biasWrite;
  InnerProductLayerParams *pIStack_198;
  float random;
  uint64_t j;
  uint64_t i;
  float *destination_weights;
  RepeatedField<float> *local_178;
  RepeatedField<float> *weightsWrite;
  InnerProductLayerParams *innerProductParams;
  uint64_t C_out;
  uint64_t C_in;
  NeuralNetworkLayer *innerProductLayer;
  long className_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<long,_std::allocator<long>_> *__range2_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  NeuralNetworkClassifier *classifier;
  DictionaryFeatureType *dictionary;
  FeatureType *outputType;
  FeatureDescription *output;
  ArrayFeatureType *local_d0;
  ArrayFeatureType *multiArray;
  FeatureType *local_b8;
  FeatureType *inputType;
  FeatureDescription *input;
  bool usesStringClassLabels;
  vector<long,_std::allocator<long>_> *pvStack_a0;
  bool includeBias_local;
  vector<long,_std::allocator<long>_> *intClassLabels_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stringClassLabels_local;
  TensorAttributes *inTensorAttr_local;
  Model *pMStack_80;
  bool isUpdatable_local;
  Model *m_local;
  FeatureType *local_70;
  char *local_68;
  FeatureDescription *local_60;
  char *local_58;
  FeatureDescription *local_50;
  char *local_48;
  ModelDescription *local_40;
  char *local_38;
  ModelDescription *local_30;
  char *local_28;
  NeuralNetworkLayer *local_20;
  char *local_18;
  NeuralNetworkLayer *local_10;
  
  input._7_1_ = includeBias;
  pvStack_a0 = intClassLabels;
  intClassLabels_local = (vector<long,_std::allocator<long>_> *)stringClassLabels;
  stringClassLabels_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)inTensorAttr;
  inTensorAttr_local._7_1_ = isUpdatable;
  pMStack_80 = m;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(stringClassLabels);
  input._6_1_ = sVar5 != 0;
  pMVar6 = CoreML::Specification::Model::mutable_description(pMStack_80);
  inputType = (FeatureType *)CoreML::Specification::ModelDescription::add_input(pMVar6);
  pFVar7 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar7);
  local_b8 = pFVar7;
  local_d0 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar7);
  this = CoreML::Specification::ArrayFeatureType::mutable_shape(local_d0);
  output = (FeatureDescription *)
           (long)*(int *)&(stringClassLabels_local->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
  google::protobuf::RepeatedField<long>::Add(this,(long *)&output);
  CoreML::Specification::ArrayFeatureType::set_datatype
            (local_d0,ArrayFeatureType_ArrayDataType_DOUBLE);
  local_70 = inputType;
  m_local = (Model *)stringClassLabels_local;
  pbVar8 = &inputType->isoptional_;
  pbVar1 = (stringClassLabels_local->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation(&inputType->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)pbVar8,pbVar1,pAVar9);
  CoreML::Specification::FeatureDescription::set_allocated_type
            ((FeatureDescription *)inputType,local_b8);
  pMVar6 = CoreML::Specification::Model::mutable_description(pMStack_80);
  pFVar10 = CoreML::Specification::ModelDescription::add_output(pMVar6);
  pFVar7 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar7);
  if ((input._6_1_ & 1) == 0) {
    CoreML::Specification::FeatureType::mutable_int64type(pFVar7);
  }
  else {
    CoreML::Specification::FeatureType::mutable_stringtype(pFVar7);
  }
  local_68 = "predictedClass";
  local_60 = pFVar10;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar10->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar10->name_,"predictedClass",pAVar9);
  CoreML::Specification::FeatureDescription::set_allocated_type(pFVar10,pFVar7);
  pMVar6 = CoreML::Specification::Model::mutable_description(pMStack_80);
  pFVar10 = CoreML::Specification::ModelDescription::add_output(pMVar6);
  pFVar7 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar7);
  this_00 = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar7);
  if ((input._6_1_ & 1) == 0) {
    CoreML::Specification::DictionaryFeatureType::mutable_int64keytype(this_00);
  }
  else {
    CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this_00);
  }
  local_58 = "classProbabilities";
  local_50 = pFVar10;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar10->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            (&pFVar10->name_,"classProbabilities",pAVar9);
  CoreML::Specification::FeatureDescription::set_allocated_type(pFVar10,pFVar7);
  local_40 = CoreML::Specification::Model::mutable_description(pMStack_80);
  local_48 = "predictedClass";
  pAVar11 = &local_40->predictedfeaturename_;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation(&local_40->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar11,"predictedClass",pAVar9);
  local_30 = CoreML::Specification::Model::mutable_description(pMStack_80);
  local_38 = "classProbabilities";
  pAVar11 = &local_30->predictedprobabilitiesname_;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation(&local_30->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar11,"classProbabilities",pAVar9)
  ;
  this_01 = CoreML::Specification::Model::mutable_neuralnetworkclassifier(pMStack_80);
  if ((input._6_1_ & 1) == 0) {
    __end2_1 = std::vector<long,_std::allocator<long>_>::begin(intClassLabels);
    className_1 = (long)std::vector<long,_std::allocator<long>_>::end(intClassLabels);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&className_1), bVar2) {
      plVar13 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator*(&__end2_1);
      innerProductLayer = (NeuralNetworkLayer *)*plVar13;
      this_03 = CoreML::Specification::NeuralNetworkClassifier::mutable_int64classlabels(this_01);
      CoreML::Specification::Int64Vector::add_vector(this_03,(int64_t)innerProductLayer);
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end2_1);
    }
  }
  else {
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(stringClassLabels);
    className.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(stringClassLabels);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&className.field_2 + 8)), bVar2) {
      pbVar12 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      std::__cxx11::string::string((string *)&__range2_1,(string *)pbVar12);
      this_02 = CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels(this_01);
      CoreML::Specification::StringVector::add_vector(this_02,(string *)&__range2_1);
      std::__cxx11::string::~string((string *)&__range2_1);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  C_in = (uint64_t)CoreML::Specification::NeuralNetworkClassifier::add_layers(this_01);
  local_28 = "inner_product";
  pAVar11 = &((NeuralNetworkLayer *)C_in)->name_;
  local_20 = (NeuralNetworkLayer *)C_in;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation((MessageLite *)C_in);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar11,"inner_product",pAVar9);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)C_in,
             (char *)(stringClassLabels_local->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)C_in,"intermediateOutput");
  C_out = (uint64_t)
          *(int *)&(stringClassLabels_local->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
  innerProductParams = (InnerProductLayerParams *)0x0;
  if ((input._6_1_ & 1) == 0) {
    innerProductParams =
         (InnerProductLayerParams *)std::vector<long,_std::allocator<long>_>::size(intClassLabels);
  }
  else {
    innerProductParams =
         (InnerProductLayerParams *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::size(stringClassLabels);
  }
  weightsWrite = (RepeatedField<float> *)
                 CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                           ((NeuralNetworkLayer *)C_in);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels
            ((InnerProductLayerParams *)weightsWrite,C_out);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels
            ((InnerProductLayerParams *)weightsWrite,(uint64_t)innerProductParams);
  pWVar14 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                      ((InnerProductLayerParams *)weightsWrite);
  local_178 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar14);
  destination_weights._4_4_ = 0;
  google::protobuf::RepeatedField<float>::Resize
            (local_178,(int)C_out * (int)innerProductParams,
             (float *)((long)&destination_weights + 4));
  i = (uint64_t)google::protobuf::RepeatedField<float>::mutable_data(local_178);
  for (j = 0; j < C_out; j = j + 1) {
    for (pIStack_198 = (InnerProductLayerParams *)0x0; pIStack_198 < innerProductParams;
        pIStack_198 = (InnerProductLayerParams *)
                      ((long)&(pIStack_198->super_MessageLite)._vptr_MessageLite + 1)) {
      iVar4 = rand();
      biasWrite._4_4_ = (float)iVar4 / 2.1474836e+09;
      *(float *)(i + (long)((long)&(pIStack_198->super_MessageLite)._vptr_MessageLite +
                           j * (long)innerProductParams) * 4) = biasWrite._4_4_;
    }
  }
  if ((input._7_1_ & 1) != 0) {
    CoreML::Specification::InnerProductLayerParams::set_hasbias
              ((InnerProductLayerParams *)weightsWrite,true);
    pWVar14 = CoreML::Specification::InnerProductLayerParams::mutable_bias
                        ((InnerProductLayerParams *)weightsWrite);
    local_1a8 = CoreML::Specification::WeightParams::mutable_floatvalue(pWVar14);
    destination_bias._4_4_ = 0;
    google::protobuf::RepeatedField<float>::Resize
              (local_1a8,(int)innerProductParams,(float *)((long)&destination_bias + 4));
    i_1 = (uint64_t)google::protobuf::RepeatedField<float>::mutable_data(local_1a8);
    for (j_1 = 0; j_1 == 0; j_1 = j_1 + 1) {
      for (pIStack_1c8 = (InnerProductLayerParams *)0x0; pIStack_1c8 < innerProductParams;
          pIStack_1c8 = (InnerProductLayerParams *)
                        ((long)&(pIStack_1c8->super_MessageLite)._vptr_MessageLite + 1)) {
        iVar4 = rand();
        softmaxLayer._4_4_ = (float)iVar4 / 2.1474836e+09;
        *(float *)(i_1 + (long)((long)&(pIStack_1c8->super_MessageLite)._vptr_MessageLite +
                               j_1 * (long)innerProductParams) * 4) = softmaxLayer._4_4_;
      }
    }
  }
  local_1d8 = CoreML::Specification::NeuralNetworkClassifier::add_layers(this_01);
  local_18 = "softmax";
  pAVar11 = &local_1d8->name_;
  local_10 = local_1d8;
  pAVar9 = google::protobuf::MessageLite::GetArenaForAllocation(&local_1d8->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar11,"softmax",pAVar9);
  CoreML::Specification::NeuralNetworkLayer::add_input(local_1d8,"intermediateOutput");
  CoreML::Specification::NeuralNetworkLayer::add_output(local_1d8,"scoreVector");
  CoreML::Specification::NeuralNetworkLayer::mutable_softmax(local_1d8);
  if ((inTensorAttr_local._7_1_ & 1) != 0) {
    CoreML::Specification::Model::set_isupdatable(pMStack_80,true);
    CoreML::Specification::NeuralNetworkLayer::set_isupdatable((NeuralNetworkLayer *)C_in,true);
    pWVar14 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                        ((InnerProductLayerParams *)weightsWrite);
    CoreML::Specification::WeightParams::set_isupdatable(pWVar14,true);
    if ((input._7_1_ & 1) != 0) {
      pWVar14 = CoreML::Specification::InnerProductLayerParams::mutable_bias
                          ((InnerProductLayerParams *)weightsWrite);
      CoreML::Specification::WeightParams::set_isupdatable(pWVar14,true);
    }
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (pMStack_80,this_01,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (this_01,kSgdOptimizer,0.699999988079071,0.0,1.0);
    local_238[2] = 0x40;
    local_238[3] = 0x80;
    local_238[0] = 0x10;
    local_238[1] = 0x20;
    local_218 = local_238;
    local_210 = 4;
    std::allocator<long>::allocator(&local_23a);
    __l._M_len = local_210;
    __l._M_array = local_218;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              (&local_208,__l,&local_239,&local_23a);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (this_01,kSgdOptimizer,0x20,1,100,&local_208);
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_208);
    std::allocator<long>::~allocator(&local_23a);
    local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_278._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    local_278._M_t._M_impl._0_8_ = 0;
    local_278._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_278._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set(&local_278);
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>(this_01,100,1,100,&local_278);
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set(&local_278);
    _Stack_2a0._M_right = (_Base_ptr)0x0;
    sStack_280 = 0;
    _Stack_2a0._M_parent = (_Base_ptr)0x0;
    _Stack_2a0._M_left = (_Base_ptr)0x0;
    __range2_2 = (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x0;
    _Stack_2a0._M_color = _S_red;
    _Stack_2a0._4_4_ = 0;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&__range2_2);
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (this_01,0x7e3,0,0x7e3,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&__range2_2);
    std::set<long,_std::less<long>,_std::allocator<long>_>::~set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&__range2_2);
    pMVar6 = CoreML::Specification::Model::mutable_description(pMStack_80);
    CoreML::Specification::ModelDescription::clear_traininginput(pMVar6);
    pMVar6 = CoreML::Specification::Model::description(pMStack_80);
    pRVar15 = CoreML::Specification::ModelDescription::input(pMVar6);
    __end2_2 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (pRVar15);
    feature._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar15)
    ;
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2_2,(iterator *)&feature._cached_size_), bVar2) {
      pFVar16 = google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                          (&__end2_2);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInput,pFVar16);
      pMVar6 = CoreML::Specification::Model::mutable_description(pMStack_80);
      pRVar15 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar6);
      pFVar10 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                          (pRVar15);
      CoreML::Specification::FeatureDescription::CopyFrom
                (pFVar10,(FeatureDescription *)&trainingInput);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInput);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2_2);
    }
    pMVar6 = CoreML::Specification::Model::description(pMStack_80);
    pRVar15 = CoreML::Specification::ModelDescription::output(pMVar6);
    __end2_3 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::begin
                         (pRVar15);
    feature_1._40_8_ =
         google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::end(pRVar15)
    ;
    while (bVar2 = google::protobuf::internal::
                   RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator!=
                             (&__end2_3,(iterator *)&feature_1._cached_size_), bVar2) {
      pFVar16 = google::protobuf::internal::
                RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator*
                          (&__end2_3);
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)&trainingInput_1,pFVar16);
      __lhs = CoreML::Specification::FeatureDescription::name_abi_cxx11_
                        ((FeatureDescription *)&trainingInput_1);
      pMVar6 = CoreML::Specification::Model::description(pMStack_80);
      __rhs = CoreML::Specification::ModelDescription::predictedfeaturename_abi_cxx11_(pMVar6);
      _Var3 = std::operator==(__lhs,__rhs);
      if (_Var3) {
        pMVar6 = CoreML::Specification::Model::mutable_description(pMStack_80);
        pRVar15 = CoreML::Specification::ModelDescription::mutable_traininginput(pMVar6);
        pFVar10 = google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::Add
                            (pRVar15);
        CoreML::Specification::FeatureDescription::CopyFrom
                  (pFVar10,(FeatureDescription *)&trainingInput_1);
      }
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)&trainingInput_1);
      google::protobuf::internal::
      RepeatedPtrIterator<const_CoreML::Specification::FeatureDescription>::operator++(&__end2_3);
    }
  }
  return this_01;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}